

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

int If_Dec6SuppSize(word t)

{
  word wVar1;
  word wVar2;
  int iVar;
  int iVar3;
  
  iVar3 = 0;
  for (iVar = 0; iVar != 6; iVar = iVar + 1) {
    wVar1 = If_Dec6Cofactor(t,iVar,0);
    wVar2 = If_Dec6Cofactor(t,iVar,1);
    iVar3 = iVar3 + (uint)(wVar1 != wVar2);
  }
  return iVar3;
}

Assistant:

static inline int If_Dec6SuppSize( word t )
{
    int v, Count = 0;
    for ( v = 0; v < 6; v++ )
        if ( If_Dec6Cofactor(t, v, 0) != If_Dec6Cofactor(t, v, 1) )
            Count++;
    return Count;
}